

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

double __thiscall BGIPSolution::GetPayoff(BGIPSolution *this)

{
  _List_node_base *p_Var1;
  double in_XMM0_Qa;
  
  if (this->_m_useFixedCapacityPriorityQueue == true) {
    if ((this->_m_qFixedK)._m_l.
        super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
        ._M_impl._M_node._M_size == 0) {
      if ((this->_m_qpFixedK)._m_l.
          super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
          ._M_impl._M_node._M_size == 0) {
        return -1.79769313486232e+308;
      }
      p_Var1 = (this->_m_qpFixedK)._m_l.
               super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    }
    else {
      p_Var1 = (this->_m_qFixedK)._m_l.
               super__List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    }
    p_Var1 = p_Var1 + 1;
  }
  else {
    p_Var1 = (_List_node_base *)
             (this->_m_qInfSize->c).
             super__Vector_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((_List_node_base *)
         (this->_m_qInfSize->c).
         super__Vector_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
         ._M_impl.super__Vector_impl_data._M_finish == p_Var1) &&
       (p_Var1 = (_List_node_base *)
                 (this->_m_qpInfSize->c).
                 super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (_List_node_base *)
       (this->_m_qpInfSize->c).
       super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
       ._M_impl.super__Vector_impl_data._M_finish == p_Var1)) {
      return -1.79769313486232e+308;
    }
  }
  (*(code *)p_Var1->_M_next->_M_next[1]._M_prev)();
  return in_XMM0_Qa;
}

Assistant:

double BGIPSolution::GetPayoff() const
{ 
    if(_m_useFixedCapacityPriorityQueue)
    {
        if(_m_qFixedK.size() > 0)
            return(_m_qFixedK.top()->GetValue());
        else if(_m_qpFixedK.size() > 0)
            return(_m_qpFixedK.top()->GetValue());
        else
            return(-DBL_MAX);
    }
    else
    {
        if(_m_qInfSize->size() > 0)
            return(_m_qInfSize->top()->GetValue());
        else if(_m_qpInfSize->size() > 0)
            return(_m_qpInfSize->top()->GetValue());
        else
            return(-DBL_MAX);
    }
}